

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void expr_emit_or(Parser *psr,Node *left,Node right)

{
  int iVar1;
  int target;
  Node *left_local;
  Parser *psr_local;
  Node right_local;
  
  right_local._0_8_ = right.field_1;
  psr_local._0_4_ = right.type;
  expr_to_jmp(psr,(Node *)&psr_local);
  jmp_ensure_false_falls_through(psr,left);
  jmp_list_patch(psr,(left->field_1).jmp.false_list,(left->field_1).prim + 1);
  (left->field_1).jmp.false_list = right_local._4_4_;
  iVar1 = jmp_list_merge(psr,(left->field_1).reloc_idx,right_local.type);
  (left->field_1).reloc_idx = iVar1;
  return;
}

Assistant:

static void expr_emit_or(Parser *psr, Node *left, Node right) {
	// Emit code to convert `right` to a jump, if necessary
	expr_to_jmp(psr, &right);

	// We need to ensure the false case falls through
	jmp_ensure_false_falls_through(psr, left);

	// Point left's false case to the start of right, which is 1 instruction
	// after the end of left; we KNOW that the true case must come last since
	// we just ensured it with the previous function call
	int target = left->jmp.true_list + 1;
	jmp_list_patch(psr, left->jmp.false_list, target);

	// The result's false case is right's false case
	left->jmp.false_list = right.jmp.false_list;

	// The result's true case is the merge of left and right's true lists
	left->jmp.true_list = jmp_list_merge(psr, left->jmp.true_list,
		right.jmp.true_list);
}